

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::FlattenParameter::InternalSerializeWithCachedSizesToArray
          (FlattenParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  uint8 *puVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    uVar7 = (ulong)this->axis_;
    pbVar5 = target + 1;
    *target = '\b';
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar7;
    target = pbVar5 + 1;
  }
  if ((uVar1 & 2) != 0) {
    uVar6 = (ulong)this->end_axis_;
    pbVar5 = target + 1;
    *target = 0x10;
    uVar7 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar5 = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar7;
    target = pbVar5 + 1;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FlattenParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.FlattenParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->axis(), target);
  }

  // optional int32 end_axis = 2 [default = -1];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->end_axis(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.FlattenParameter)
  return target;
}